

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

bool __thiscall
senjo::PerftCommandHandle::Process
          (PerftCommandHandle *this,char *params,uint64_t *count,uint64_t *nodes,uint64_t *qnodes)

{
  ChessEngine *pCVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int depth;
  byte *pbVar8;
  uint64_t node_count;
  uint64_t qnode_count;
  Output local_60;
  Output local_58;
  uint64_t *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  long local_38;
  
  uVar2 = (int)params[1] - 0x30;
  if (uVar2 < 10) {
    pbVar8 = (byte *)(params + 2);
    depth = 0;
    do {
      depth = uVar2 + depth * 10;
      bVar5 = *pbVar8;
      uVar6 = (uint)(char)bVar5;
      uVar2 = uVar6 - 0x30;
      pbVar8 = pbVar8 + 1;
    } while (uVar2 < 10);
    if ((depth != 0) &&
       (local_50 = count, local_48 = nodes, local_40 = qnodes,
       bVar5 != 0 && (depth <= this->maxDepth || this->maxDepth == 0))) {
      do {
        iVar3 = isspace((int)(char)uVar6);
        if (iVar3 == 0) {
          if (9 < (int)(char)uVar6 - 0x30U) {
            return true;
          }
          uVar7 = 0;
          do {
            uVar7 = ((long)(char)uVar6 + uVar7 * 10) - 0x30;
            uVar6 = (uint)(char)*pbVar8;
            pbVar8 = pbVar8 + 1;
          } while (uVar6 - 0x30 < 10);
          if (uVar7 == 0) {
            return true;
          }
          if ((this->maxLeafs != 0) && (this->maxLeafs < uVar7)) {
            return true;
          }
          Output::Output(&local_60,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- ",4);
          std::ostream::operator<<((ostream *)&std::cout,depth);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," => ",4);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          Output::~Output(&local_60);
          pCVar1 = (this->super_BackgroundCommand).engine;
          if (this->qperft == true) {
            uVar4 = ChessEngine::QPerft(pCVar1,depth);
          }
          else {
            uVar4 = ChessEngine::Perft(pCVar1,depth);
          }
          local_60._vptr_Output = (_func_int **)0x0;
          local_38 = 0;
          pCVar1 = (this->super_BackgroundCommand).engine;
          (*pCVar1->_vptr_ChessEngine[0x10])(pCVar1,0,0,&local_60,&local_38,0,0,0,0);
          *local_50 = *local_50 + uVar4;
          *local_48 = *local_48 + (long)local_60._vptr_Output;
          *local_40 = *local_40 + local_38;
          bVar5 = uVar4 == uVar7 | this->qperft;
          if (bVar5 != 0) {
            return (bool)bVar5;
          }
          Output::Output(&local_58,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- ",4);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          Output::~Output(&local_58);
          return false;
        }
        bVar5 = *pbVar8;
        uVar6 = (uint)bVar5;
        pbVar8 = pbVar8 + 1;
      } while (bVar5 != 0);
    }
  }
  return true;
}

Assistant:

bool PerftCommandHandle::Process(const char* params, uint64_t& count,
                                 uint64_t& nodes, uint64_t& qnodes)
{
  const char* p = (params + 1);
  int depth = 0;
  while (*p && isdigit(*p)) {
    depth = ((10 * depth) + (*p++ - '0'));
    if (depth < 0) {
      Output() << "invalid depth: " << params;
      return true;
    }
  }
  if (!depth || (maxDepth && (depth > maxDepth))) {
    return true;
  }

  NextWord(p);

  uint64_t expected = 0;
  while (*p && isdigit(*p)) {
    expected = ((10 * expected) + (*p++ - '0'));
  }
  if (!expected || (maxLeafs && (expected > maxLeafs))) {
    return true;
  }

  Output() << "--- " << depth << " => " << expected;
  uint64_t perft_count = qperft ? engine->QPerft(depth) : engine->Perft(depth);
  uint64_t node_count = 0;
  uint64_t qnode_count = 0;

  engine->GetStats(NULL, NULL, &node_count, &qnode_count);
  count += perft_count;
  nodes += node_count;
  qnodes += qnode_count;

  if (!qperft && (perft_count != expected)) {
    Output() << "--- " << perft_count << " != " << expected;
    return false;
  }

  return true;
}